

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O2

void __thiscall adiosStream::getADIOSArray(adiosStream *this,shared_ptr<VariableInfo> *ov)

{
  bool bVar1;
  element_type *peVar2;
  Variable<double> v;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  
  peVar2 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar2->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      (peVar2->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    std::vector<char,_std::allocator<char>_>::resize(&peVar2->data,peVar2->datasize);
    peVar2 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  bVar1 = std::operator==(&peVar2->type,"double");
  if (bVar1) {
    v.m_Variable = (Variable<double> *)adios2::IO::InquireVariable<double>((string *)&this->io);
    bVar1 = adios2::Variable::operator_cast_to_bool((Variable *)&v);
    if (bVar1) {
      peVar2 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                (&local_48,&peVar2->start,&peVar2->count);
      adios2::Variable<double>::SetSelection((pair *)&v);
      std::
      pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::~pair(&local_48);
      adios2::Engine::Get<double>
                (&this->engine,v.m_Variable,
                 (((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->data)
                 .super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start,6);
      goto LAB_00113772;
    }
  }
  else {
    bVar1 = std::operator==(&((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->type,"float");
    if (bVar1) {
      v.m_Variable = (Variable<double> *)adios2::IO::InquireVariable<float>((string *)&this->io);
      bVar1 = adios2::Variable::operator_cast_to_bool((Variable *)&v);
      if (bVar1) {
        peVar2 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                  (&local_48,&peVar2->start,&peVar2->count);
        adios2::Variable<float>::SetSelection((pair *)&v);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(&local_48);
        adios2::Engine::Get<float>
                  (&this->engine,v.m_Variable,
                   (((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,6);
LAB_00113772:
        bVar1 = true;
        goto LAB_00113778;
      }
    }
    else {
      bVar1 = std::operator==(&((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->type,"int");
      if (!bVar1) {
        return;
      }
      v.m_Variable = (Variable<double> *)adios2::IO::InquireVariable<int>((string *)&this->io);
      bVar1 = adios2::Variable::operator_cast_to_bool((Variable *)&v);
      if (bVar1) {
        peVar2 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                  (&local_48,&peVar2->start,&peVar2->count);
        adios2::Variable<int>::SetSelection((pair *)&v);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(&local_48);
        adios2::Engine::Get<int>
                  (&this->engine,v.m_Variable,
                   (((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,6);
        goto LAB_00113772;
      }
    }
  }
  bVar1 = false;
LAB_00113778:
  ((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->readFromInput = bVar1
  ;
  return;
}

Assistant:

void adiosStream::getADIOSArray(std::shared_ptr<VariableInfo> ov)
{
    // Allocate memory on first access
    if (!ov->data.size())
    {
        ov->data.resize(ov->datasize);
    }
    if (ov->type == "double")
    {
        adios2::Variable<double> v = io.InquireVariable<double>(ov->name);
        if (!v)
        {
            ov->readFromInput = false;
            return;
        }
        v.SetSelection({ov->start, ov->count});
        double *a = reinterpret_cast<double *>(ov->data.data());
        engine.Get<double>(v, a);
        ov->readFromInput = true;
    }
    else if (ov->type == "float")
    {
        adios2::Variable<float> v = io.InquireVariable<float>(ov->name);
        if (!v)
        {
            ov->readFromInput = false;
            return;
        }
        v.SetSelection({ov->start, ov->count});
        float *a = reinterpret_cast<float *>(ov->data.data());
        engine.Get<float>(v, a);
        ov->readFromInput = true;
    }
    else if (ov->type == "int")
    {
        adios2::Variable<int> v = io.InquireVariable<int>(ov->name);
        if (!v)
        {
            ov->readFromInput = false;
            return;
        }
        v.SetSelection({ov->start, ov->count});
        int *a = reinterpret_cast<int *>(ov->data.data());
        engine.Get<int>(v, a);
        ov->readFromInput = true;
    }
}